

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

void * __thiscall camp::Class::applyOffset(Class *this,void *pointer,Class *target)

{
  int iVar1;
  long lVar2;
  ClassUnrelated *__return_storage_ptr__;
  void *pvVar3;
  string local_b0;
  string local_90;
  ClassUnrelated local_70;
  
  if (pointer == (void *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    iVar1 = baseOffset(this,target);
    if (iVar1 == -1) {
      iVar1 = baseOffset(target,this);
      if (iVar1 == -1) {
        __return_storage_ptr__ = (ClassUnrelated *)__cxa_allocate_exception(0x48);
        ClassUnrelated::ClassUnrelated(&local_70,&this->m_name,&target->m_name);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
                   ,"");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"void *camp::Class::applyOffset(void *, const Class &) const"
                   ,"");
        Error::prepare<camp::ClassUnrelated>
                  (__return_storage_ptr__,&local_70,&local_90,0xc2,&local_b0);
        __cxa_throw(__return_storage_ptr__,&ClassUnrelated::typeinfo,Error::~Error);
      }
      lVar2 = -(long)iVar1;
    }
    else {
      lVar2 = (long)iVar1;
    }
    pvVar3 = (void *)((long)pointer + lVar2);
  }
  return pvVar3;
}

Assistant:

void* Class::applyOffset(void* pointer, const Class& target) const
{
    // Special case for null pointers: don't apply offset to leave them null
    if (!pointer)
        return pointer;

    // Check target as a base class of this
    int offset = baseOffset(target);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) + offset);

    // Check target as a derived class of this
    offset = target.baseOffset(*this);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) - offset);

    // No match found, target is not a base class nor a derived class of this
    CAMP_ERROR(ClassUnrelated(name(), target.name()));
}